

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexdumper.h
# Opt level: O2

int Hex::Hexdumper<unsigned_char>::count_identical_lines(uchar *first,uchar *last,int unitsperline)

{
  bool bVar1;
  int iVar2;
  uchar *puVar3;
  pair<const_unsigned_char_*,_const_unsigned_char_*> thisline;
  pair<const_unsigned_char_*,_const_unsigned_char_*> firstline;
  
  firstline.second = first + unitsperline;
  if (last <= first + unitsperline) {
    firstline.second = last;
  }
  iVar2 = 1;
  thisline.first = firstline.second;
  firstline.first = first;
  while( true ) {
    if (last <= thisline.first) {
      return iVar2;
    }
    puVar3 = thisline.first + unitsperline;
    if (last <= thisline.first + unitsperline) {
      puVar3 = last;
    }
    thisline.second = puVar3;
    bVar1 = data_is_equal<std::pair<unsigned_char_const*,unsigned_char_const*>>
                      (&firstline,&thisline);
    if (!bVar1) break;
    iVar2 = iVar2 + 1;
    thisline.first = puVar3;
  }
  return iVar2;
}

Assistant:

static int count_identical_lines(const T*first, const T*last, int unitsperline)
    {
        auto p = first;
        auto pend = std::min(last, p+unitsperline);
        auto firstline = std::make_pair(p, pend);

        int count = 1;

        p = pend;
        while (p<last) {
            auto pend = std::min(last, p+unitsperline);
            auto thisline = std::make_pair(p, pend);

            if (!data_is_equal(firstline, thisline))
                break;

            count++;

            p = pend;
        }

        return count;
    }